

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::drawSubtreeRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QRegion *exposedRegion,QWidget *widget,qreal parentOpacity,
          QTransform *effectTransform)

{
  undefined1 *puVar1;
  double dVar2;
  long lVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem **ppQVar5;
  ulong uVar6;
  QGraphicsEffect *pQVar7;
  QGraphicsItemEffectSourcePrivate *this_00;
  undefined1 auVar8 [12];
  quint32 qVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  bool bVar13;
  char cVar14;
  int iVar15;
  qreal *pqVar16;
  QTransform *pQVar17;
  qreal *pqVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  QRectF *pQVar24;
  QTransform *pQVar25;
  undefined8 *puVar26;
  QTransform *pQVar27;
  QGraphicsItemPaintInfo *pQVar28;
  bool bVar29;
  long in_FS_OFFSET;
  bool wasDirtyParentSceneTransform;
  byte bVar30;
  qreal opacity;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  QWidget *copy;
  QGraphicsItemPaintInfo info;
  QTransform local_128;
  QRectF boundingRect;
  undefined2 local_90;
  QTransform transform;
  
  bVar30 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (item->d_ptr).d;
  uVar21 = *(ulong *)&pQVar4->field_0x160;
  if (((uVar21 & 0x20) == 0) ||
     (lVar20 = (pQVar4->children).d.size, ((byte)(uVar21 >> 0x2a) & lVar20 == 0) != 0))
  goto LAB_0061ad4c;
  if ((((uint)(uVar21 >> 0x26) & 1) == 0 && pQVar4->parent != (QGraphicsItem *)0x0) &&
     ((((pQVar4->parent->d_ptr).d)->field_0x164 & 0x80) == 0)) {
    opacity = parentOpacity * pQVar4->opacity;
  }
  else {
    opacity = pQVar4->opacity;
  }
  if (opacity < 0.001) {
    if ((lVar20 == 0) || (uVar6 = (pQVar4->children).d.size, uVar6 == 0)) goto LAB_0061ad4c;
    if (((uVar21 >> 0x27 & 1) == 0) &&
       (ppQVar5 = (pQVar4->children).d.ptr,
       (*(ulong *)&(((*ppQVar5)->d_ptr).d)->field_0x160 & 0x4000000000) == 0)) {
      uVar10 = 1;
      do {
        uVar22 = uVar10;
        if (uVar6 == uVar22) break;
        uVar10 = uVar22 + 1;
      } while ((*(ulong *)&((ppQVar5[uVar22]->d_ptr).d)->field_0x160 & 0x4000000000) == 0);
      if (uVar6 <= uVar22) goto LAB_0061ad4c;
    }
  }
  pQVar17 = &transform;
  pqVar16 = (qreal *)&DAT_00702c58;
  pQVar25 = pQVar17;
  for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
    pQVar25->m_matrix[0][0] = *pqVar16;
    pqVar16 = pqVar16 + 1;
    pQVar25 = (QTransform *)(pQVar25->m_matrix[0] + 1);
  }
  if ((uVar21 & 0x2000040000) == 0) {
    wasDirtyParentSceneTransform = (uVar21 >> 0x35 & 1) != 0;
    if (wasDirtyParentSceneTransform) {
      (*pQVar4->_vptr_QGraphicsItemPrivate[2])(pQVar4);
    }
    pQVar17 = (QTransform *)0x0;
  }
  else {
    if (viewTransform == (QTransform *)0x0) {
      pqVar16 = (qreal *)&DAT_00702c10;
      pqVar18 = (qreal *)&local_128;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *pqVar18 = *pqVar16;
        pqVar16 = pqVar16 + 1;
        pqVar18 = pqVar18 + 1;
      }
      local_128._72_2_ = local_128._72_2_ & 0xfc00;
    }
    else {
      pqVar16 = (qreal *)viewTransform;
      pqVar18 = (qreal *)&local_128;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *pqVar18 = *pqVar16;
        pqVar16 = pqVar16 + 1;
        pqVar18 = pqVar18 + 1;
      }
      local_128._72_2_ = *(undefined2 *)&viewTransform->field_0x48;
    }
    QGraphicsItem::deviceTransform((QTransform *)&boundingRect,item,&local_128);
    pQVar24 = &boundingRect;
    pQVar25 = pQVar17;
    for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
      pQVar25->m_matrix[0][0] = (*(qreal (*) [3])&pQVar24->xp)[0];
      pQVar24 = (QRectF *)((long)pQVar24 + (ulong)bVar30 * -0x10 + 8);
      pQVar25 = (QTransform *)((long)pQVar25 + (ulong)bVar30 * -0x10 + 8);
    }
    transform._72_2_ = local_90;
    wasDirtyParentSceneTransform = false;
  }
  pQVar4 = (item->d_ptr).d;
  uVar6 = *(ulong *)&pQVar4->field_0x160;
  bVar23 = (uVar21 >> 0x2a & 1) == 0 && 0.001 <= opacity;
  if ((bVar23) || (bVar11 = bVar23, 0.0 < this->minimumRenderSize)) {
    boundingRect.w = -NAN;
    boundingRect.h = -NAN;
    boundingRect.xp = -NAN;
    boundingRect.yp = -NAN;
    QGraphicsItemPrivate::effectiveBoundingRect(&boundingRect,pQVar4,(QGraphicsItem *)0x0);
    if ((boundingRect.w == 0.0) && (!NAN(boundingRect.w))) {
      boundingRect.xp = boundingRect.xp + -1e-05;
      boundingRect.yp = boundingRect.yp + 0.0;
      boundingRect.w = boundingRect.w + 2e-05;
      boundingRect.h = boundingRect.h + 0.0;
    }
    if ((boundingRect.h == 0.0) && (!NAN(boundingRect.h))) {
      boundingRect.xp = boundingRect.xp + 0.0;
      boundingRect.yp = boundingRect.yp + -1e-05;
      boundingRect.w = boundingRect.w + 0.0;
      boundingRect.h = boundingRect.h + 2e-05;
    }
    if (pQVar17 == (QTransform *)0x0) {
      pQVar4 = (item->d_ptr).d;
      pQVar17 = &pQVar4->sceneTransform;
      if (viewTransform == (QTransform *)0x0) {
        bVar11 = (pQVar4->field_0x167 & 0x40) >> 6;
      }
      else {
        pQVar25 = &transform;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          pQVar25->m_matrix[0][0] = pQVar17->m_matrix[0][0];
          pQVar17 = (QTransform *)((long)pQVar17 + (ulong)bVar30 * -0x10 + 8);
          pQVar25 = (QTransform *)((long)pQVar25 + (ulong)bVar30 * -0x10 + 8);
        }
        transform._72_2_ = *(undefined2 *)&(pQVar4->sceneTransform).field_0x48;
        QTransform::operator*=(&transform,viewTransform);
        bVar11 = 0;
        pQVar17 = &transform;
      }
    }
    else {
      bVar11 = 0;
    }
    local_128.m_matrix[0][2] = -NAN;
    local_128.m_matrix[1][0] = -NAN;
    local_128.m_matrix[0][0] = -NAN;
    local_128.m_matrix[0][1] = -NAN;
    if (bVar11 == 0) {
      QTransform::mapRect((QRectF *)&local_128);
    }
    else {
      local_128.m_matrix[0][0] = pQVar17->m_matrix[2][0] + boundingRect.xp;
      local_128.m_matrix[0][1] = pQVar17->m_matrix[2][1] + boundingRect.yp;
      local_128.m_matrix[0][2] = boundingRect.w;
      local_128.m_matrix[1][0] = boundingRect.h;
    }
    dVar2 = this->minimumRenderSize;
    bVar13 = false;
    bVar29 = bVar23;
    if (0.0 < dVar2) {
      bVar13 = local_128.m_matrix[0][2] < dVar2 || local_128.m_matrix[1][0] < dVar2;
      bVar29 = (local_128.m_matrix[0][2] >= dVar2 && local_128.m_matrix[1][0] >= dVar2) && bVar23;
    }
    if (bVar29) {
      info.viewTransform = (QTransform *)&DAT_aaaaaaaaaaaaaaaa;
      info.transformPtr = (QTransform *)&DAT_aaaaaaaaaaaaaaaa;
      auVar31 = QRectF::toAlignedRect();
      qVar9 = this->rectAdjust;
      info.viewTransform = (QTransform *)CONCAT44(auVar31._4_4_ - qVar9,auVar31._0_4_ - qVar9);
      auVar8._4_8_ = auVar31._8_8_;
      auVar8._0_4_ = auVar31._4_4_ + qVar9;
      auVar32._0_8_ = auVar8._0_8_ << 0x20;
      auVar32._8_4_ = auVar31._8_4_ + qVar9;
      auVar32._12_4_ = auVar31._12_4_ + qVar9;
      info.transformPtr = auVar32._8_8_;
      if (widget != (QWidget *)0x0) {
        copy = widget;
        QHash<QWidget*,QRect>::emplace<QRect_const&>
                  ((QHash<QWidget*,QRect> *)&((item->d_ptr).d)->paintedViewBoundingRects,&copy,
                   (QRect *)&info);
      }
      if (exposedRegion == (QRegion *)0x0) {
        auVar32 = QRect::normalized();
        bVar11 = auVar32._4_4_ <= auVar32._12_4_ && auVar32._0_4_ <= auVar32._8_4_;
      }
      else {
        bVar11 = QRegion::intersects((QRect *)exposedRegion);
      }
      bVar12 = bVar11 ^ 1;
    }
    else {
      bVar12 = 0;
      bVar11 = 0;
    }
    if (bVar13 || (bVar12 & 1) != 0) {
      if (lVar20 == 0) goto LAB_0061ad4c;
      if ((uVar6 & 0x8001000000000) != 0) {
        if ((wasDirtyParentSceneTransform != false) &&
           (pQVar4 = (item->d_ptr).d, (pQVar4->children).d.size != 0)) {
          uVar21 = 0;
          do {
            puVar1 = &(((pQVar4->children).d.ptr[uVar21]->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
            uVar21 = uVar21 + 1;
          } while (uVar21 < (ulong)(pQVar4->children).d.size);
        }
        goto LAB_0061ad4c;
      }
    }
  }
  if (((lVar20 != 0) && ((uVar6 & 0x8001000000000) != 0)) && (pQVar17 == (QTransform *)0x0)) {
    pQVar4 = (item->d_ptr).d;
    pQVar25 = &pQVar4->sceneTransform;
    pQVar17 = pQVar25;
    if (viewTransform != (QTransform *)0x0) {
      pQVar17 = &transform;
      pQVar27 = pQVar17;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        pQVar27->m_matrix[0][0] = pQVar25->m_matrix[0][0];
        pQVar25 = (QTransform *)((long)pQVar25 + (ulong)bVar30 * -0x10 + 8);
        pQVar27 = (QTransform *)((long)pQVar27 + (ulong)bVar30 * -0x10 + 8);
      }
      transform._72_2_ = *(undefined2 *)&(pQVar4->sceneTransform).field_0x48;
      QTransform::operator*=(pQVar17,viewTransform);
    }
  }
  pQVar7 = ((item->d_ptr).d)->graphicsEffect;
  if ((pQVar7 == (QGraphicsEffect *)0x0) || (bVar13 = QGraphicsEffect::isEnabled(pQVar7), !bVar13))
  {
    draw(this,item,painter,viewTransform,pQVar17,exposedRegion,widget,opacity,effectTransform,
         wasDirtyParentSceneTransform,(bool)bVar11);
    goto LAB_0061ad4c;
  }
  if (pQVar17 == (QTransform *)0x0) {
    pQVar4 = (item->d_ptr).d;
    pQVar25 = &pQVar4->sceneTransform;
    pQVar17 = pQVar25;
    if (viewTransform != (QTransform *)0x0) {
      pQVar17 = &transform;
      pQVar27 = pQVar17;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        pQVar27->m_matrix[0][0] = pQVar25->m_matrix[0][0];
        pQVar25 = (QTransform *)((long)pQVar25 + (ulong)bVar30 * -0x10 + 8);
        pQVar27 = (QTransform *)((long)pQVar27 + (ulong)bVar30 * -0x10 + 8);
      }
      transform._72_2_ = *(undefined2 *)&(pQVar4->sceneTransform).field_0x48;
      QTransform::operator*=(pQVar17,viewTransform);
    }
  }
  puVar26 = &DAT_00702530;
  pQVar28 = &info;
  for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
    pQVar28->viewTransform = (QTransform *)*puVar26;
    puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
    pQVar28 = (QGraphicsItemPaintInfo *)((long)pQVar28 + (ulong)bVar30 * -0x10 + 8);
  }
  info.option = &this->styleOptionTmp;
  info.effectTransform = effectTransform;
  info._64_1_ = bVar23 * '\x02' + wasDirtyParentSceneTransform | info._64_1_ & 0xfc;
  this_00 = *(QGraphicsItemEffectSourcePrivate **)
             (*(long *)(*(long *)&((item->d_ptr).d)->graphicsEffect->field_0x8 + 0x78) + 8);
  this_00->info = &info;
  pqVar16 = (qreal *)&DAT_00702c58;
  pQVar24 = &boundingRect;
  for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
    pQVar24->xp = *pqVar16;
    pqVar16 = pqVar16 + (ulong)bVar30 * -2 + 1;
    pQVar24 = (QRectF *)((long)pQVar24 + (ulong)bVar30 * -0x10 + 8);
  }
  info.viewTransform = viewTransform;
  info.transformPtr = pQVar17;
  info.exposedRegion = exposedRegion;
  info.widget = widget;
  info.painter = painter;
  info.opacity = opacity;
  pqVar16 = (qreal *)QPainter::worldTransform();
  pQVar24 = &boundingRect;
  for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
    pQVar24->xp = *pqVar16;
    pqVar16 = pqVar16 + (ulong)bVar30 * -2 + 1;
    pQVar24 = (QRectF *)((long)pQVar24 + (ulong)bVar30 * -0x10 + 8);
  }
  if (effectTransform != (QTransform *)0x0) {
    QTransform::operator*(&local_128,pQVar17);
    pQVar17 = &local_128;
  }
  QPainter::setWorldTransform((QTransform *)painter,SUB81(pQVar17,0));
  QPainter::setOpacity(opacity);
  if ((this_00->super_QGraphicsEffectSourcePrivate).m_cachedSystem != LogicalCoordinates) {
    pQVar17 = (QTransform *)QPainter::worldTransform();
    cVar14 = QTransform::operator!=(&this_00->lastEffectTransform,pQVar17);
    if (cVar14 != '\0') {
      iVar15 = QTransform::type();
      if (iVar15 < 2) {
        QPainter::worldTransform();
        iVar15 = QTransform::type();
        if (1 < iVar15) goto LAB_0061acee;
        local_128.m_matrix[0][2] = -NAN;
        local_128.m_matrix[1][0] = -NAN;
        local_128.m_matrix[0][0] = -NAN;
        local_128.m_matrix[0][1] = -NAN;
        (**(code **)(*(long *)&this_00->super_QGraphicsEffectSourcePrivate + 0x28))
                  ((QRectF *)&local_128,this_00,0);
        QGraphicsItemEffectSourcePrivate::paddedEffectRect
                  ((QRectF *)&copy,this_00,DeviceCoordinates,
                   (this_00->super_QGraphicsEffectSourcePrivate).m_cachedMode,(QRectF *)&local_128,
                   (bool *)0x0);
        copy = (QWidget *)QRectF::toAlignedRect();
        QGraphicsEffectSourcePrivate::setCachedOffset
                  (&this_00->super_QGraphicsEffectSourcePrivate,(QPoint *)&copy);
      }
      else {
LAB_0061acee:
        QGraphicsEffectSourcePrivate::invalidateCache
                  (&this_00->super_QGraphicsEffectSourcePrivate,TransformChanged);
      }
      pqVar18 = (qreal *)QPainter::worldTransform();
      pqVar16 = pqVar18;
      pQVar17 = &this_00->lastEffectTransform;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        pQVar17->m_matrix[0][0] = *pqVar16;
        pqVar16 = pqVar16 + (ulong)bVar30 * -2 + 1;
        pQVar17 = (QTransform *)((long)pQVar17 + (ulong)bVar30 * -0x10 + 8);
      }
      *(undefined2 *)&(this_00->lastEffectTransform).field_0x48 = *(undefined2 *)(pqVar18 + 9);
    }
  }
  pQVar7 = ((item->d_ptr).d)->graphicsEffect;
  (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,painter);
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&boundingRect,0));
  this_00->info = (QGraphicsItemPaintInfo *)0x0;
LAB_0061ad4c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::drawSubtreeRecursive(QGraphicsItem *item, QPainter *painter,
                                                 const QTransform *const viewTransform,
                                                 QRegion *exposedRegion, QWidget *widget,
                                                 qreal parentOpacity, const QTransform *const effectTransform)
{
    Q_ASSERT(item);

    if (!item->d_ptr->visible)
        return;

    const bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents && !itemHasChildren)
        return; // Item has neither contents nor children!(?)

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity()))
        return;

    QTransform transform(Qt::Uninitialized);
    QTransform *transformPtr = nullptr;
    bool translateOnlyTransform = false;
#define ENSURE_TRANSFORM_PTR \
    if (!transformPtr) { \
        Q_ASSERT(!itemIsUntransformable); \
        if (viewTransform) { \
            transform = item->d_ptr->sceneTransform; \
            transform *= *viewTransform; \
            transformPtr = &transform; \
        } else { \
            transformPtr = &item->d_ptr->sceneTransform; \
            translateOnlyTransform = item->d_ptr->sceneTransformTranslateOnly; \
        } \
    }

    // Update the item's scene transform if the item is transformable;
    // otherwise calculate the full transform,
    bool wasDirtyParentSceneTransform = false;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (itemIsUntransformable) {
        transform = item->deviceTransform(viewTransform ? *viewTransform : QTransform());
        transformPtr = &transform;
    } else if (item->d_ptr->dirtySceneTransform) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
        wasDirtyParentSceneTransform = true;
    }

    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                           || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape);
    bool drawItem = itemHasContents && !itemIsFullyTransparent;
    if (drawItem || minimumRenderSize > 0.0) {
        const QRectF brect = adjustedItemEffectiveBoundingRect(item);
        ENSURE_TRANSFORM_PTR
        QRectF preciseViewBoundingRect = translateOnlyTransform ? brect.translated(transformPtr->dx(), transformPtr->dy())
                                                                : transformPtr->mapRect(brect);

        bool itemIsTooSmallToRender = false;
        if (minimumRenderSize > 0.0
            && (preciseViewBoundingRect.width() < minimumRenderSize
                || preciseViewBoundingRect.height() < minimumRenderSize)) {
           itemIsTooSmallToRender = true;
           drawItem = false;
        }

        bool itemIsOutsideVisibleRect = false;
        if (drawItem) {
            QRect viewBoundingRect = preciseViewBoundingRect.toAlignedRect();
            viewBoundingRect.adjust(-int(rectAdjust), -int(rectAdjust), rectAdjust, rectAdjust);
            if (widget)
                item->d_ptr->paintedViewBoundingRects.insert(widget, viewBoundingRect);
            drawItem = exposedRegion ? exposedRegion->intersects(viewBoundingRect)
                                     : !viewBoundingRect.normalized().isEmpty();
            itemIsOutsideVisibleRect = !drawItem;
        }

        if (itemIsTooSmallToRender || itemIsOutsideVisibleRect) {
            // We cannot simply use !drawItem here. If we did it is possible
            // to enter the outer if statement with drawItem == false and minimumRenderSize > 0
            // and finally end up inside this inner if, even though none of the above two
            // conditions are met. In that case we should not return from this function
            // but call draw() instead.
            if (!itemHasChildren)
                return;
            if (itemClipsChildrenToShape) {
                if (wasDirtyParentSceneTransform)
                    item->d_ptr->invalidateChildrenSceneTransform();
                return;
            }
        }
    } // else we know for sure this item has children we must process.

    if (itemHasChildren && itemClipsChildrenToShape)
        ENSURE_TRANSFORM_PTR;

#if QT_CONFIG(graphicseffect)
    if (item->d_ptr->graphicsEffect && item->d_ptr->graphicsEffect->isEnabled()) {
        ENSURE_TRANSFORM_PTR;
        QGraphicsItemPaintInfo info(viewTransform, transformPtr, effectTransform, exposedRegion, widget, &styleOptionTmp,
                                    painter, opacity, wasDirtyParentSceneTransform, itemHasContents && !itemIsFullyTransparent);
        QGraphicsEffectSource *source = item->d_ptr->graphicsEffect->d_func()->source;
        QGraphicsItemEffectSourcePrivate *sourced = static_cast<QGraphicsItemEffectSourcePrivate *>
                                                    (source->d_func());
        sourced->info = &info;
        const QTransform restoreTransform = painter->worldTransform();
        if (effectTransform)
            painter->setWorldTransform(*transformPtr * *effectTransform);
        else
            painter->setWorldTransform(*transformPtr);
        painter->setOpacity(opacity);

        if (sourced->currentCachedSystem() != Qt::LogicalCoordinates
            && sourced->lastEffectTransform != painter->worldTransform())
        {
            if (sourced->lastEffectTransform.type() <= QTransform::TxTranslate
                && painter->worldTransform().type() <= QTransform::TxTranslate)
            {
                QRectF sourceRect = sourced->boundingRect(Qt::DeviceCoordinates);
                QRect effectRect = sourced->paddedEffectRect(Qt::DeviceCoordinates, sourced->currentCachedMode(), sourceRect).toAlignedRect();

                sourced->setCachedOffset(effectRect.topLeft());
            } else {
                sourced->invalidateCache(QGraphicsEffectSourcePrivate::TransformChanged);
            }

            sourced->lastEffectTransform = painter->worldTransform();
        }

        item->d_ptr->graphicsEffect->draw(painter);
        painter->setWorldTransform(restoreTransform);
        sourced->info = nullptr;
    } else
#endif // QT_CONFIG(graphicseffect)
    {
        draw(item, painter, viewTransform, transformPtr, exposedRegion, widget, opacity,
             effectTransform, wasDirtyParentSceneTransform, drawItem);
    }
}